

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::Marray<unsigned_char,std::allocator<unsigned_long>>::Marray<unsigned_long_const*>
          (Marray<unsigned_char,std::allocator<unsigned_long>> *this,unsigned_long *begin,
          unsigned_long *end,uchar *value,CoordinateOrder *coordinateOrder,allocator_type *allocator
          )

{
  size_t j;
  unsigned_long *puVar1;
  uchar *data;
  size_type sVar2;
  size_type __n;
  allocator_type local_39;
  allocator_type *local_38;
  
  local_38 = allocator;
  View<unsigned_char,_false,_std::allocator<unsigned_long>_>::View
            ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this,&local_39);
  __n = 1;
  for (puVar1 = begin; puVar1 != end; puVar1 = puVar1 + 1) {
    __n = __n * *puVar1;
  }
  marray_detail::Assert<bool>(__n != 0);
  data = __gnu_cxx::new_allocator<unsigned_char>::allocate
                   ((new_allocator<unsigned_char> *)(this + 0x40),__n,(void *)0x0);
  View<unsigned_char,false,std::allocator<unsigned_long>>::assign<unsigned_long_const*>
            ((View<unsigned_char,false,std::allocator<unsigned_long>> *)this,begin,end,data,
             coordinateOrder,coordinateOrder,local_38);
  for (sVar2 = 0; __n != sVar2; sVar2 = sVar2 + 1) {
    *(uchar *)(*(long *)this + sVar2) = *value;
  }
  Marray<unsigned_char,_std::allocator<unsigned_long>_>::testInvariant
            ((Marray<unsigned_char,_std::allocator<unsigned_long>_> *)this);
  return;
}

Assistant:

inline
Marray<T, A>::Marray
(
    ShapeIterator begin,
    ShapeIterator end,
    const T& value,
    const CoordinateOrder& coordinateOrder,
    const allocator_type& allocator
)
: dataAllocator_(allocator)
{
    std::size_t size = std::accumulate(begin, end, static_cast<std::size_t>(1), 
        std::multiplies<std::size_t>());
    marray_detail::Assert(MARRAY_NO_ARG_TEST || size != 0);
    base::assign(begin, end, dataAllocator_.allocate(size), coordinateOrder, 
        coordinateOrder, allocator); 
    for(std::size_t j=0; j<size; ++j) {
        this->data_[j] = value;
    }
    testInvariant();
}